

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

UBool __thiscall icu_63::OrConstraint::isFulfilled(OrConstraint *this,IFixedDecimal *number)

{
  AndConstraint *local_30;
  AndConstraint *andRule;
  OrConstraint *pOStack_20;
  UBool result;
  OrConstraint *orRule;
  IFixedDecimal *number_local;
  OrConstraint *this_local;
  
  andRule._7_1_ = '\0';
  for (pOStack_20 = this; pOStack_20 != (OrConstraint *)0x0 && andRule._7_1_ == '\0';
      pOStack_20 = pOStack_20->next) {
    andRule._7_1_ = '\x01';
    for (local_30 = pOStack_20->childNode; local_30 != (AndConstraint *)0x0 && andRule._7_1_ != '\0'
        ; local_30 = local_30->next) {
      andRule._7_1_ = AndConstraint::isFulfilled(local_30,number);
    }
  }
  return andRule._7_1_;
}

Assistant:

UBool
OrConstraint::isFulfilled(const IFixedDecimal &number) {
    OrConstraint* orRule=this;
    UBool result=FALSE;

    while (orRule!=nullptr && !result) {
        result=TRUE;
        AndConstraint* andRule = orRule->childNode;
        while (andRule!=nullptr && result) {
            result = andRule->isFulfilled(number);
            andRule=andRule->next;
        }
        orRule = orRule->next;
    }

    return result;
}